

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlSBufAddString(xmlSBuf *buf,xmlChar *str,uint len)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = buf->size;
  if (buf->max - uVar2 < len) {
    if (buf->code == XML_ERR_OK) {
      buf->code = XML_ERR_RESOURCE_LIMIT;
    }
  }
  else {
    if (buf->cap - uVar2 <= len) {
      iVar1 = xmlSBufGrow(buf,len);
      if (iVar1 < 0) {
        return;
      }
      uVar2 = buf->size;
    }
    if (len != 0) {
      memcpy(buf->mem + uVar2,str,(ulong)len);
      uVar2 = buf->size;
    }
    buf->size = uVar2 + len;
  }
  return;
}

Assistant:

static void
xmlSBufAddString(xmlSBuf *buf, const xmlChar *str, unsigned len) {
    if (buf->max - buf->size < len) {
        if (buf->code == XML_ERR_OK)
            buf->code = XML_ERR_RESOURCE_LIMIT;
        return;
    }

    if (buf->cap - buf->size <= len) {
        if (xmlSBufGrow(buf, len) < 0)
            return;
    }

    if (len > 0)
        memcpy(buf->mem + buf->size, str, len);
    buf->size += len;
}